

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int allocateSpace(MemPage *pPage,int nByte,int *pIdx)

{
  uint uVar1;
  int iVar2;
  u8 *puVar3;
  int local_6c;
  int g2;
  u8 *pSpace;
  int gap;
  u8 *pTmp;
  int rc;
  int top;
  u8 *data;
  int *piStack_28;
  int hdr;
  int *pIdx_local;
  MemPage *pMStack_18;
  int nByte_local;
  MemPage *pPage_local;
  
  data._4_4_ = (uint)pPage->hdrOffset;
  _rc = pPage->aData;
  pTmp._0_4_ = 0;
  uVar1 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
  pTmp._4_4_ = (uint)CONCAT11(_rc[(int)(data._4_4_ + 5)],(_rc + (int)(data._4_4_ + 5))[1]);
  piStack_28 = pIdx;
  pIdx_local._4_4_ = nByte;
  pMStack_18 = pPage;
  if (pTmp._4_4_ < uVar1) {
    if ((pTmp._4_4_ != 0) || (pPage->pBt->usableSize != 0x10000)) {
      iVar2 = sqlite3CorruptError(0x10beb);
      return iVar2;
    }
    pTmp._4_4_ = 0x10000;
  }
  if (((_rc[(int)(data._4_4_ + 2)] != '\0') || (_rc[(int)(data._4_4_ + 1)] != '\0')) &&
     (uVar1 + 2 <= pTmp._4_4_)) {
    puVar3 = pageFindSlot(pPage,nByte,(int *)&pTmp);
    if (puVar3 != (u8 *)0x0) {
      iVar2 = (int)puVar3 - (int)_rc;
      *piStack_28 = iVar2;
      if (iVar2 <= (int)uVar1) {
        iVar2 = sqlite3CorruptError(0x10bfd);
        return iVar2;
      }
      return 0;
    }
    if ((int)pTmp != 0) {
      return (int)pTmp;
    }
  }
  if ((int)pTmp._4_4_ < (int)(uVar1 + 2 + pIdx_local._4_4_)) {
    if (pMStack_18->nFree - (pIdx_local._4_4_ + 2) < 5) {
      local_6c = pMStack_18->nFree - (pIdx_local._4_4_ + 2);
    }
    else {
      local_6c = 4;
    }
    iVar2 = defragmentPage(pMStack_18,local_6c);
    if (iVar2 != 0) {
      return iVar2;
    }
    pTmp._4_4_ = (CONCAT11(_rc[(int)(data._4_4_ + 5)],_rc[(long)(int)(data._4_4_ + 5) + 1]) - 1 &
                 0xffff) + 1;
  }
  iVar2 = pTmp._4_4_ - pIdx_local._4_4_;
  _rc[(int)(data._4_4_ + 5)] = (u8)((uint)iVar2 >> 8);
  _rc[(long)(int)(data._4_4_ + 5) + 1] = (u8)iVar2;
  *piStack_28 = iVar2;
  return 0;
}

Assistant:

static int allocateSpace(MemPage *pPage, int nByte, int *pIdx){
  const int hdr = pPage->hdrOffset;    /* Local cache of pPage->hdrOffset */
  u8 * const data = pPage->aData;      /* Local cache of pPage->aData */
  int top;                             /* First byte of cell content area */
  int rc = SQLITE_OK;                  /* Integer return code */
  u8 *pTmp;                            /* Temp ptr into data[] */
  int gap;        /* First byte of gap between cell pointers and cell content */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( nByte>=0 );  /* Minimum cell size is 4 */
  assert( pPage->nFree>=nByte );
  assert( pPage->nOverflow==0 );
  assert( nByte < (int)(pPage->pBt->usableSize-8) );

  assert( pPage->cellOffset == hdr + 12 - 4*pPage->leaf );
  gap = pPage->cellOffset + 2*pPage->nCell;
  assert( gap<=65536 );
  /* EVIDENCE-OF: R-29356-02391 If the database uses a 65536-byte page size
  ** and the reserved space is zero (the usual value for reserved space)
  ** then the cell content offset of an empty page wants to be 65536.
  ** However, that integer is too large to be stored in a 2-byte unsigned
  ** integer, so a value of 0 is used in its place. */
  pTmp = &data[hdr+5];
  top = get2byte(pTmp);
  assert( top<=(int)pPage->pBt->usableSize ); /* by btreeComputeFreeSpace() */
  if( gap>top ){
    if( top==0 && pPage->pBt->usableSize==65536 ){
      top = 65536;
    }else{
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }

  /* If there is enough space between gap and top for one more cell pointer,
  ** and if the freelist is not empty, then search the
  ** freelist looking for a slot big enough to satisfy the request.
  */
  testcase( gap+2==top );
  testcase( gap+1==top );
  testcase( gap==top );
  if( (data[hdr+2] || data[hdr+1]) && gap+2<=top ){
    u8 *pSpace = pageFindSlot(pPage, nByte, &rc);
    if( pSpace ){
      int g2;
      assert( pSpace+nByte<=data+pPage->pBt->usableSize );
      *pIdx = g2 = (int)(pSpace-data);
      if( g2<=gap ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }else{
        return SQLITE_OK;
      }
    }else if( rc ){
      return rc;
    }
  }

  /* The request could not be fulfilled using a freelist slot.  Check
  ** to see if defragmentation is necessary.
  */
  testcase( gap+2+nByte==top );
  if( gap+2+nByte>top ){
    assert( pPage->nCell>0 || CORRUPT_DB );
    assert( pPage->nFree>=0 );
    rc = defragmentPage(pPage, MIN(4, pPage->nFree - (2+nByte)));
    if( rc ) return rc;
    top = get2byteNotZero(&data[hdr+5]);
    assert( gap+2+nByte<=top );
  }


  /* Allocate memory from the gap in between the cell pointer array
  ** and the cell content area.  The btreeComputeFreeSpace() call has already
  ** validated the freelist.  Given that the freelist is valid, there
  ** is no way that the allocation can extend off the end of the page.
  ** The assert() below verifies the previous sentence.
  */
  top -= nByte;
  put2byte(&data[hdr+5], top);
  assert( top+nByte <= (int)pPage->pBt->usableSize );
  *pIdx = top;
  return SQLITE_OK;
}